

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O1

bool find_str_and_remove(char *s,char *target)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  char cVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  bool bVar10;
  ulong uVar11;
  char cVar12;
  bool bVar13;
  
  sVar2 = strlen(target);
  sVar3 = strlen(s);
  uVar4 = (uint)sVar3;
  bVar13 = 0 < (int)uVar4;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    uVar7 = sVar2 & 0xffffffff;
    bVar10 = false;
    pcVar9 = s;
    do {
      if (0 < (int)sVar2) {
        uVar11 = 0;
        do {
          cVar6 = pcVar9[uVar11];
          cVar1 = target[uVar11];
          if (cVar6 != cVar1) {
            cVar12 = cVar6 + -0x20;
            if (0x19 < (byte)(cVar6 + 0x9fU)) {
              cVar12 = cVar6;
            }
            cVar6 = cVar1 + -0x20;
            if (0x19 < (byte)(cVar1 + 0x9fU)) {
              cVar6 = cVar1;
            }
            if (cVar12 != cVar6) {
              bVar10 = false;
              goto LAB_001a0a93;
            }
          }
          uVar11 = uVar11 + 1;
        } while ((sVar2 & 0x7fffffff) != uVar11);
        bVar10 = true;
      }
LAB_001a0a93:
      if (bVar10) {
        if ((int)uVar4 < (int)uVar5 + (int)sVar2) {
          return bVar13;
        }
        lVar8 = (long)(int)uVar7 + -1;
        do {
          s[uVar5] = s[lVar8 + 1];
          uVar5 = uVar5 + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 < (long)(ulong)(uVar4 & 0x7fffffff));
        return bVar13;
      }
      uVar5 = uVar5 + 1;
      bVar13 = uVar5 < (sVar3 & 0x7fffffff);
      uVar7 = (ulong)((int)uVar7 + 1);
      pcVar9 = pcVar9 + 1;
    } while (uVar5 != (sVar3 & 0x7fffffff));
  }
  return bVar13;
}

Assistant:

bool
find_str_and_remove(char *s, const char *target)
{
  // uses a dumb algorithm
  int start, i, j;
  int len = strlen(target);
  int tot_len = strlen(s);
  bool matches = false;
  for (i = 0; i < tot_len; i++) {
    start = i;
    for (j = 0; j < len; j++) {
      if (case_compare(s[i + j], target[j]))
        matches = true;
      else {
        matches = false;
        break;
      }
    }
    if (matches) {
      for (i = start, j = start + len; j <= tot_len; i++, j++)
        // use <= on j so also copies the zero at the end
        s[i] = s[j];
      return true;
    }
  }
  // if get to here, then no match
  return false;
}